

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

double __thiscall
ON_SubDEdgeSharpness::SharpnessFromSliderValue
          (ON_SubDEdgeSharpness *this,ON_Interval slider_domain,double slider_value,
          double invalid_input_result)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  ON_Interval slider_domain_local;
  ON_Interval ZeroToMaximumSharpness;
  
  slider_domain_local.m_t[1] = slider_domain.m_t[1];
  slider_domain_local.m_t[0] = slider_domain.m_t[0];
  bVar1 = ON_Interval::IsInterval(&slider_domain_local);
  if (!bVar1) {
    return invalid_input_result;
  }
  dVar3 = ON_Interval::Min(&slider_domain_local);
  if (slider_value < dVar3) {
    return invalid_input_result;
  }
  dVar3 = ON_Interval::Max(&slider_domain_local);
  if (dVar3 < slider_value) {
    return invalid_input_result;
  }
  pdVar2 = ON_Interval::operator[](&slider_domain_local,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    pdVar2 = ON_Interval::operator[](&slider_domain_local,1);
    if ((*pdVar2 == 4.0) && (!NAN(*pdVar2))) {
      return slider_value;
    }
  }
  pdVar2 = ON_Interval::operator[](&slider_domain_local,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    pdVar2 = ON_Interval::operator[](&slider_domain_local,1);
    if ((*pdVar2 == 1.0) && (!NAN(*pdVar2))) goto LAB_005d1339;
  }
  slider_value = ON_Interval::NormalizedParameterAt(&slider_domain_local,slider_value);
LAB_005d1339:
  if ((0.0 <= slider_value) && (slider_value <= 1.0)) {
    ON_Interval::ON_Interval(&ZeroToMaximumSharpness,0.0,4.0);
    dVar3 = ON_Interval::ParameterAt(&ZeroToMaximumSharpness,slider_value);
    dVar3 = Sanitize(dVar3,invalid_input_result);
    invalid_input_result =
         (double)(-(ulong)(dVar3 < 0.0) & (ulong)invalid_input_result |
                 ~-(ulong)(dVar3 < 0.0) &
                 (-(ulong)(4.0 < dVar3) & (ulong)invalid_input_result |
                 ~-(ulong)(4.0 < dVar3) & (ulong)dVar3));
  }
  return invalid_input_result;
}

Assistant:

double ON_SubDEdgeSharpness::SharpnessFromSliderValue(
  ON_Interval slider_domain,
  double slider_value,
  double invalid_input_result
)
{
  if (slider_domain.IsInterval() && slider_value >= slider_domain.Min() && slider_value <= slider_domain.Max())
  {
    if (0.0 == slider_domain[0] && ON_SubDEdgeSharpness::MaximumValue == slider_domain[1])
      return slider_value;
    const double s = (0.0 == slider_domain[0] && 1.0 == slider_domain[1]) ? slider_value : slider_domain.NormalizedParameterAt(slider_value);
    if (s >= 0.0 && s <= 1.0)
    {
      const ON_Interval ZeroToMaximumSharpness(0.0, ON_SubDEdgeSharpness::MaximumValue);
      double sharpness = ON_SubDEdgeSharpness::Sanitize(ZeroToMaximumSharpness.ParameterAt(s), invalid_input_result);
      if (sharpness >= 0.0 && sharpness <= ON_SubDEdgeSharpness::MaximumValue)
        return sharpness;
    }
  }
  return invalid_input_result;
}